

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O1

TypeRenderer *
google::protobuf::util::converter::ProtoStreamObjectSource::FindTypeRenderer(string *type_url)

{
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_true>
  _Var1;
  
  std::call_once<void(&)()>((once_flag *)&source_renderers_init_,InitRendererMap);
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::Status_(*)(const_google::protobuf::util::converter::ProtoStreamObjectSource_*,_const_google::protobuf::Type_&,_google::protobuf::StringPiece,_google::protobuf::util::converter::ObjectWriter_*)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(renderers__abi_cxx11_,type_url);
  if (_Var1._M_cur != (__node_type *)0x0) {
    _Var1._M_cur = (__node_type *)((long)_Var1._M_cur + 0x28);
  }
  return (TypeRenderer *)_Var1._M_cur;
}

Assistant:

ProtoStreamObjectSource::TypeRenderer*
ProtoStreamObjectSource::FindTypeRenderer(const std::string& type_url) {
  PROTOBUF_NAMESPACE_ID::internal::call_once(source_renderers_init_,
                                             InitRendererMap);
  return FindOrNull(*renderers_, type_url);
}